

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Builder * __thiscall
capnp::Orphan<capnp::DynamicValue>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  bool bVar1;
  char cVar2;
  uint16_t uVar3;
  size_t sVar4;
  RawBrandedSchema *pRVar5;
  char *pcVar6;
  SegmentBuilder *pSVar7;
  CapTableBuilder *pCVar8;
  StructPointerCount SVar9;
  undefined1 uVar10;
  ListElementCount LVar11;
  BitsPerElementN<23> BVar12;
  ElementSize EVar13;
  uint uVar14;
  int64_t iVar15;
  Which elementType;
  uint uVar16;
  ListBuilder *__return_storage_ptr___00;
  ArrayPtr<unsigned_char> AVar17;
  Fault f;
  Schema local_f0;
  Reader local_e8;
  Builder local_b8;
  StructBuilder local_a0;
  ListBuilder local_78;
  ListBuilder local_50;
  
  switch(this->type) {
  case UNKNOWN:
    __return_storage_ptr__->type = UNKNOWN;
    break;
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar1 = (this->field_1).boolValue;
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = bVar1;
    break;
  case INT:
    iVar15 = (this->field_1).intValue;
    __return_storage_ptr__->type = INT;
    goto LAB_00294ab7;
  case UINT:
    iVar15 = (this->field_1).intValue;
    __return_storage_ptr__->type = UINT;
LAB_00294ab7:
    (__return_storage_ptr__->field_1).intValue = iVar15;
    break;
  case FLOAT:
    iVar15 = (this->field_1).intValue;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = iVar15;
    break;
  case TEXT:
    _::OrphanBuilder::asText(&local_b8,&this->builder);
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_b8.content.size_;
    (__return_storage_ptr__->field_1).intValue = local_b8._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = local_b8.content.ptr;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    AVar17 = (ArrayPtr<unsigned_char>)_::OrphanBuilder::asData(&this->builder);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar17;
    break;
  case LIST:
    cVar2 = *(char *)((long)&this->field_1 + 2);
    iVar15 = (this->field_1).intValue;
    pcVar6 = *(char **)((long)&this->field_1 + 8);
    if ((cVar2 == '\0') && ((this->field_1).listSchema.elementType.baseType == STRUCT)) {
      local_f0.raw = (RawBrandedSchema *)Type::asStruct((Type *)&(this->field_1).enumValue);
      Schema::getProto(&local_e8,&local_f0);
      uVar16 = 0;
      uVar14 = 0;
      if (0x7f < local_e8._reader.dataSize) {
        uVar14 = (uint)*(ushort *)
                        ((long)&(((CapTableBuilder *)((long)local_e8._reader.data + 8))->
                                super_CapTableReader)._vptr_CapTableReader + 6);
      }
      if (0xcf < local_e8._reader.dataSize) {
        uVar16 = (uint)*(ushort *)
                        &(((CapTableBuilder *)((long)local_e8._reader.data + 0x18))->
                         super_CapTableReader)._vptr_CapTableReader << 0x10;
      }
      __return_storage_ptr___00 = &local_50;
      _::OrphanBuilder::asStructList
                (__return_storage_ptr___00,&this->builder,(StructSize)(uVar16 | uVar14));
    }
    else {
      elementType = LIST;
      if (cVar2 == '\0') {
        elementType = (this->field_1).listSchema.elementType.baseType;
      }
      EVar13 = anon_unknown_71::elementSizeFor(elementType);
      __return_storage_ptr___00 = &local_78;
      _::OrphanBuilder::asList(__return_storage_ptr___00,&this->builder,EVar13);
    }
    SVar9 = __return_storage_ptr___00->structPointerCount;
    EVar13 = __return_storage_ptr___00->elementSize;
    uVar10 = __return_storage_ptr___00->field_0x27;
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         __return_storage_ptr___00->structDataSize;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) = SVar9;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = EVar13;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = uVar10;
    pSVar7 = __return_storage_ptr___00->segment;
    pCVar8 = __return_storage_ptr___00->capTable;
    LVar11 = __return_storage_ptr___00->elementCount;
    BVar12 = __return_storage_ptr___00->step;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = __return_storage_ptr___00->ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = LVar11;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = BVar12;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)pSVar7;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = pCVar8;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).intValue = iVar15;
    (__return_storage_ptr__->field_1).textValue.content.ptr = pcVar6;
    break;
  case ENUM:
    iVar15 = (this->field_1).intValue;
    uVar3 = (this->field_1).enumValue.value;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = iVar15;
    *(uint16_t *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    pRVar5 = (RawBrandedSchema *)(this->field_1).intValue;
    local_f0.raw = pRVar5;
    Schema::getProto(&local_e8,&local_f0);
    uVar16 = 0;
    uVar14 = 0;
    if (0x7f < local_e8._reader.dataSize) {
      uVar14 = (uint)*(ushort *)
                      ((long)&(((CapTableBuilder *)((long)local_e8._reader.data + 8))->
                              super_CapTableReader)._vptr_CapTableReader + 6);
    }
    if (0xcf < local_e8._reader.dataSize) {
      uVar16 = (uint)*(ushort *)
                      &(((CapTableBuilder *)((long)local_e8._reader.data + 0x18))->
                       super_CapTableReader)._vptr_CapTableReader << 0x10;
    }
    _::OrphanBuilder::asStruct(&local_a0,&this->builder,(StructSize)(uVar16 | uVar14));
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_a0._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a0.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_a0.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_a0.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_a0.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)pRVar5;
    break;
  case CAPABILITY:
    sVar4 = (this->field_1).intValue;
    _::OrphanBuilder::asCapability((OrphanBuilder *)&local_e8);
    __return_storage_ptr__->type = CAPABILITY;
    *(undefined4 *)&__return_storage_ptr__->field_1 = local_e8._reader.segment._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = local_e8._reader.segment._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_e8._reader.capTable._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = local_e8._reader.capTable._4_4_;
    (__return_storage_ptr__->field_1).textValue.content.size_ = sVar4;
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[100]>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x82b,FAILED,(char *)0x0,
               "\"Can\'t get() an AnyPointer orphan; there is no underlying pointer to \" \"wrap in an AnyPointer::Builder.\""
               ,(char (*) [100])
                "Can\'t get() an AnyPointer orphan; there is no underlying pointer to wrap in an AnyPointer::Builder."
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder Orphan<DynamicValue>::get() {
  switch (type) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return voidValue;
    case DynamicValue::BOOL: return boolValue;
    case DynamicValue::INT: return intValue;
    case DynamicValue::UINT: return uintValue;
    case DynamicValue::FLOAT: return floatValue;
    case DynamicValue::ENUM: return enumValue;

    case DynamicValue::TEXT: return builder.asText();
    case DynamicValue::DATA: return builder.asData();
    case DynamicValue::LIST:
      if (listSchema.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(listSchema,
            builder.asStructList(structSizeFromSchema(listSchema.getStructElementType())));
      } else {
        return DynamicList::Builder(listSchema,
            builder.asList(elementSizeFor(listSchema.whichElementType())));
      }
    case DynamicValue::STRUCT:
      return DynamicStruct::Builder(structSchema,
          builder.asStruct(structSizeFromSchema(structSchema)));
    case DynamicValue::CAPABILITY:
      return DynamicCapability::Client(interfaceSchema, builder.asCapability());
    case DynamicValue::ANY_POINTER:
      KJ_FAIL_REQUIRE("Can't get() an AnyPointer orphan; there is no underlying pointer to "
                      "wrap in an AnyPointer::Builder.");
  }
  KJ_UNREACHABLE;
}